

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

int find_extensionsGL(void)

{
  int iVar1;
  uint local_c;
  
  iVar1 = get_exts();
  if (iVar1 != 0) {
    GLAD_GL_ARB_multisample = has_ext("GL_ARB_multisample");
    GLAD_GL_ARB_robustness = has_ext("GL_ARB_robustness");
    GLAD_GL_KHR_debug = has_ext("GL_KHR_debug");
    free_exts();
  }
  local_c = (uint)(iVar1 != 0);
  return local_c;
}

Assistant:

static int find_extensionsGL(void) {
	if (!get_exts()) return 0;
	GLAD_GL_ARB_multisample = has_ext("GL_ARB_multisample");
	GLAD_GL_ARB_robustness = has_ext("GL_ARB_robustness");
	GLAD_GL_KHR_debug = has_ext("GL_KHR_debug");
	free_exts();
	return 1;
}